

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAInterface.cpp
# Opt level: O2

int handlenmeainterfacecli(SOCKET sockcli,void *pParam)

{
  byte bVar1;
  uint __i;
  int iVar2;
  long lVar3;
  timeval tv;
  fd_set sock_set;
  RS232PORT NMEAInterfacePseudoRS232Port_tmp;
  
  memcpy(&NMEAInterfacePseudoRS232Port_tmp,&NMEAInterfacePseudoRS232Port,0x318);
  if (NMEAInterfacePseudoRS232Port_tmp.DevType == 2) {
    NMEAInterfacePseudoRS232Port_tmp.s = sockcli;
  }
  if (bExit == 0) {
    bVar1 = (byte)sockcli & 0x3f;
    do {
      tv.tv_sec = 0;
      tv.tv_usec = 5000;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        sock_set.fds_bits[lVar3] = 0;
      }
      sock_set.fds_bits[sockcli / 0x40] =
           sock_set.fds_bits[sockcli / 0x40] | 1L << ((byte)sockcli & 0x3f);
      iVar2 = select(sockcli + 1,(fd_set *)0x0,(fd_set *)&sock_set,(fd_set *)0x0,(timeval *)&tv);
      sock_set.fds_bits[sockcli / 0x40] =
           sock_set.fds_bits[sockcli / 0x40] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      if ((iVar2 != 0) &&
         ((iVar2 == -1 ||
          (iVar2 = handlenmeainterface(&NMEAInterfacePseudoRS232Port_tmp), iVar2 != 0)))) {
        return 1;
      }
    } while (bExit == 0);
  }
  return 0;
}

Assistant:

int handlenmeainterfacecli(SOCKET sockcli, void* pParam)
{
	int timeout = 5;
	RS232PORT NMEAInterfacePseudoRS232Port_tmp = NMEAInterfacePseudoRS232Port;

	UNREFERENCED_PARAMETER(pParam);

	// Not thread-safe...

	if (NMEAInterfacePseudoRS232Port_tmp.DevType == TCP_SERVER_TYPE_RS232PORT) NMEAInterfacePseudoRS232Port_tmp.s = sockcli;
				
	inithandlenmeainterface(&NMEAInterfacePseudoRS232Port_tmp);

	for (;;)
	{
		fd_set sock_set;
		int iResult = SOCKET_ERROR;
		struct timeval tv;

		if (bExit) break;

		tv.tv_sec = (long)(timeout/1000);
		tv.tv_usec = (long)((timeout%1000)*1000);

		// Initialize a fd_set and add the socket to it.
		FD_ZERO(&sock_set); 
		FD_SET(sockcli, &sock_set);

		iResult = select((int)sockcli+1, NULL, &sock_set, NULL, &tv);

		// Remove the socket from the set.
		// No need to use FD_ISSET() here, as we only have one socket the return value of select() is 
		// sufficient to know what happened.
		FD_CLR(sockcli, &sock_set); 

		switch (iResult)
		{
		case SOCKET_ERROR:
			return EXIT_FAILURE;
		case 0:
			// The timeout on select() occured.
			break;
		default:
			if (handlenmeainterface(&NMEAInterfacePseudoRS232Port_tmp) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			break;
		}

		if (bExit) break;
	}

	return EXIT_SUCCESS;
}